

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::Scrollbar(ImGuiAxis axis)

{
  ImGuiWindow *pIVar1;
  ImGuiID id_00;
  float *pfVar2;
  long lVar3;
  int in_EDI;
  float fVar4;
  ImS64 scroll;
  float size_contents;
  float size_avail;
  ImDrawFlags rounding_corners;
  ImRect bb;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImS64 in_stack_00000088;
  ImS64 in_stack_00000090;
  ImS64 *in_stack_00000098;
  ImGuiAxis in_stack_000000a0;
  ImGuiID in_stack_000000a4;
  ImRect *in_stack_000000a8;
  ImDrawFlags in_stack_000000c0;
  ImGuiAxis in_stack_ffffffffffffffbc;
  ImGuiWindow *in_stack_ffffffffffffffc0;
  ImGuiAxis in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  pIVar1 = GImGui->CurrentWindow;
  id_00 = GetWindowScrollbarID(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  KeepAliveID(id_00);
  GetWindowScrollbarRect
            ((ImGuiWindow *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffcc);
  ImVec2::operator[](&(pIVar1->InnerRect).Max,(long)in_EDI);
  ImVec2::operator[](&(pIVar1->InnerRect).Min,(long)in_EDI);
  ImVec2::operator[](&pIVar1->ContentSize,(long)in_EDI);
  ImVec2::operator[](&pIVar1->WindowPadding,(long)in_EDI);
  pfVar2 = ImVec2::operator[](&pIVar1->Scroll,(long)in_EDI);
  lVar3 = (long)*pfVar2;
  ScrollbarEx(in_stack_000000a8,in_stack_000000a4,in_stack_000000a0,in_stack_00000098,
              in_stack_00000090,in_stack_00000088,in_stack_000000c0);
  fVar4 = (float)lVar3;
  pfVar2 = ImVec2::operator[](&pIVar1->Scroll,(long)in_EDI);
  *pfVar2 = fVar4;
  return;
}

Assistant:

void ImGui::Scrollbar(ImGuiAxis axis)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImGuiID id = GetWindowScrollbarID(window, axis);
    KeepAliveID(id);

    // Calculate scrollbar bounding box
    ImRect bb = GetWindowScrollbarRect(window, axis);
    ImDrawFlags rounding_corners = ImDrawFlags_RoundCornersNone;
    if (axis == ImGuiAxis_X)
    {
        rounding_corners |= ImDrawFlags_RoundCornersBottomLeft;
        if (!window->ScrollbarY)
            rounding_corners |= ImDrawFlags_RoundCornersBottomRight;
    }
    else
    {
        if ((window->Flags & ImGuiWindowFlags_NoTitleBar) && !(window->Flags & ImGuiWindowFlags_MenuBar))
            rounding_corners |= ImDrawFlags_RoundCornersTopRight;
        if (!window->ScrollbarX)
            rounding_corners |= ImDrawFlags_RoundCornersBottomRight;
    }
    float size_avail = window->InnerRect.Max[axis] - window->InnerRect.Min[axis];
    float size_contents = window->ContentSize[axis] + window->WindowPadding[axis] * 2.0f;
    ImS64 scroll = (ImS64)window->Scroll[axis];
    ScrollbarEx(bb, id, axis, &scroll, (ImS64)size_avail, (ImS64)size_contents, rounding_corners);
    window->Scroll[axis] = (float)scroll;
}